

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_functions_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::EliminateDeadFunctionsPass::Process(EliminateDeadFunctionsPass *this)

{
  Module *pMVar1;
  Function *pFVar2;
  _Hash_node_base *p_Var3;
  Function *pFVar4;
  UptrVector *pUVar5;
  ulong uVar6;
  Status SVar7;
  IRContext *context;
  iterator iVar8;
  unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
  live_function_set;
  iterator local_88;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = &local_58;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_functions_pass.cpp:29:31)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_functions_pass.cpp:29:31)>
             ::_M_manager;
  IRContext::ProcessReachableCallTree
            ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_78);
  context = (this->super_MemPass).super_Pass.context_;
  pMVar1 = (context->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_88.container_ = &pMVar1->functions_;
  local_88.iterator_._M_current =
       *(unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> **)
        &(pMVar1->functions_).
         super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
         ._M_impl;
  iVar8.iterator_._M_current = local_88.iterator_._M_current;
  iVar8.container_ = local_88.container_;
  if (local_88.iterator_._M_current ==
      *(pointer *)
       ((long)&(pMVar1->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
       + 8)) {
    SVar7 = SuccessWithoutChange;
  }
  else {
    SVar7 = Failure;
    do {
      pUVar5 = iVar8.container_;
      pFVar2 = ((iVar8.iterator_._M_current._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
      uVar6 = (ulong)pFVar2 % local_58._M_bucket_count;
      if (local_58._M_buckets[uVar6] != (__node_base_ptr)0x0) {
        p_Var3 = local_58._M_buckets[uVar6]->_M_nxt;
        pFVar4 = (Function *)p_Var3[1]._M_nxt;
        do {
          if (pFVar2 == pFVar4) {
            iVar8.iterator_._M_current = iVar8.iterator_._M_current._M_current + 1;
            iVar8.container_ = pUVar5;
            goto LAB_0059f0ed;
          }
          p_Var3 = p_Var3->_M_nxt;
        } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                (pFVar4 = (Function *)p_Var3[1]._M_nxt,
                (ulong)pFVar4 % local_58._M_bucket_count == uVar6));
      }
      iVar8 = eliminatedeadfunctionsutil::EliminateFunction(context,&local_88);
      local_88.container_ = iVar8.container_;
      context = (this->super_MemPass).super_Pass.context_;
      SVar7 = 1;
LAB_0059f0ed:
      local_88.iterator_ = iVar8.iterator_._M_current;
      pMVar1 = (context->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    } while ((iVar8.container_ != &pMVar1->functions_) ||
            (local_88.iterator_._M_current !=
             *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8)));
    SVar7 = SVar7 ^ SuccessWithoutChange;
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  std::
  _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  return SVar7;
}

Assistant:

Pass::Status EliminateDeadFunctionsPass::Process() {
  // Identify live functions first.  Those that are not live
  // are dead.
  std::unordered_set<const Function*> live_function_set;
  ProcessFunction mark_live = [&live_function_set](Function* fp) {
    live_function_set.insert(fp);
    return false;
  };
  context()->ProcessReachableCallTree(mark_live);

  bool modified = false;
  for (auto funcIter = get_module()->begin();
       funcIter != get_module()->end();) {
    if (live_function_set.count(&*funcIter) == 0) {
      modified = true;
      funcIter =
          eliminatedeadfunctionsutil::EliminateFunction(context(), &funcIter);
    } else {
      ++funcIter;
    }
  }

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}